

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::VerifyCheckPad(Recycler *this,void *address,size_t size)

{
  ulong uVar1;
  ulong *corruptedAddress;
  bool local_41;
  ulong *local_38;
  byte *i;
  size_t padding;
  size_t *paddingAddress;
  size_t size_local;
  void *address_local;
  Recycler *this_local;
  
  corruptedAddress = (ulong *)((long)address + (size - 8));
  uVar1 = *corruptedAddress;
  if (uVar1 == 0xcacacacacacacaca) {
    VerifyCheckFill(address,size);
  }
  else {
    local_41 = (ulong)this->verifyPad + 8 <= uVar1 && uVar1 < size;
    VerifyCheck((uint)local_41,L"Invalid padding size",address,corruptedAddress);
    for (local_38 = (ulong *)((long)address + (size - uVar1)); local_38 < corruptedAddress;
        local_38 = (ulong *)((long)local_38 + 1)) {
      VerifyCheck((uint)((char)*local_38 == -0x36),L"buffer overflow",address,local_38);
    }
  }
  return;
}

Assistant:

void Recycler::VerifyCheckPad(void * address, size_t size)
{
    size_t * paddingAddress = (size_t *)((byte *)address + size - sizeof(size_t));
    size_t padding = *paddingAddress;

#pragma warning(suppress:4310)
    if (padding == (size_t)0xCACACACACACACACA)
    {
        // Nascent block have objects that are not initialized with pad size
        Recycler::VerifyCheckFill(address, size);
        return;
    }
    Recycler::VerifyCheck(padding >= verifyPad + sizeof(size_t) &&  padding < size, _u("Invalid padding size"), address, paddingAddress);
    for (byte * i = (byte *)address + size - padding; i < (byte *)paddingAddress; i++)
    {
        Recycler::VerifyCheck(*i == Recycler::VerifyMemFill, _u("buffer overflow"), address, i);
    }
}